

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::TestBody(optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  long *plVar4;
  char *in_R9;
  AssertHelper local_210;
  Message local_208;
  long local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_5;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  opt_type o2;
  other_opt_type o1;
  optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  mp::opt<int,_mp::opt_null_value_policy<int,_2147483647>_>::opt<const_int_&,_true,_true>
            ((opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)((long)&o2.storage_ + 4),
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
              other_value_1);
  mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::opt
            ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::
  operator=<int,_mp::opt_null_value_policy<int,_2147483647>,_true>
            ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_,
             (opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)((long)&o2.storage_ + 4));
  testing::AssertionResult::AssertionResult<mp::opt<int,mp::opt_null_value_policy<int,2147483647>>>
            ((AssertionResult *)local_30,
             (opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)((long)&o2.storage_ + 4),
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_30,(AssertionResult *)0x20bf26,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x29e,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_81 = mp::opt<int,_mp::opt_null_value_policy<int,_2147483647>_>::has_value
                       ((opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)
                        ((long)&o2.storage_ + 4));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_80,(AssertionResult *)"o1.has_value()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x29f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  piVar3 = mp::opt<int,_mp::opt_null_value_policy<int,_2147483647>_>::operator*
                     ((opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)
                      ((long)&o2.storage_ + 4));
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_c8,"this->value_1","*o1",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  piVar3 = mp::opt<int,_mp::opt_null_value_policy<int,_2147483647>_>::value
                     ((opt<int,_mp::opt_null_value_policy<int,_2147483647>_> *)
                      ((long)&o2.storage_ + 4));
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_e8,"this->value_1","o1.value()",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             piVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_10c = mp::opt<int,mp::opt_null_value_policy<int,2147483647>>::value_or<int_const&>
                        ((opt<int,mp::opt_null_value_policy<int,2147483647>> *)
                         ((long)&o2.storage_ + 4),
                         &(this->
                          super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
                          other_value_2);
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_108,"this->value_1","o1.value_or(this->other_value_2)",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             &local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  testing::AssertionResult::AssertionResult<mp::opt<long,mp::opt_null_value_policy<long,_1l>>>
            ((AssertionResult *)local_130,
             (opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_130,(AssertionResult *)0x20b8e9,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_171 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::has_value
                        ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_170,
               (AssertionResult *)"o2.has_value()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  plVar4 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::operator*
                     ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_1b8,"this->value_1","*o2",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             plVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  plVar4 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::value
                     ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_1d8,"this->value_1","o2.value()",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             plVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_200 = mp::opt<long,mp::opt_null_value_policy<long,-1l>>::value_or<long_const&>
                        ((opt<long,mp::opt_null_value_policy<long,_1l>> *)&gtest_ar_.message_,
                         &(this->
                          super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
                          value_2);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_1f8,"this->value_1","o2.value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             &local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentNotEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1{this->other_value_1};
  opt_type o2;
  o2 = o1;
  EXPECT_TRUE(o1);
  EXPECT_TRUE(o1.has_value());
  EXPECT_EQ(this->value_1, *o1);
  EXPECT_EQ(this->value_1, o1.value());
  EXPECT_EQ(this->value_1, o1.value_or(this->other_value_2));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}